

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::step_push
          (xpath_ast_node *this,xpath_node_set_raw *ns,xml_node_struct *n,xpath_allocator *alloc)

{
  char_t *pcVar1;
  char_t cVar2;
  char_t *pcVar3;
  xpath_node *pxVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  xpath_node local_28;
  
  if (n == (xml_node_struct *)0x0) {
    __assert_fail("n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0x266c,
                  "bool pugi::impl::(anonymous namespace)::xpath_ast_node::step_push(xpath_node_set_raw &, xml_node_struct *, xpath_allocator *)"
                 );
  }
  if (7 < (byte)this->_test - 1) {
    __assert_fail("false && \"Unknown axis\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0x26af,
                  "bool pugi::impl::(anonymous namespace)::xpath_ast_node::step_push(xpath_node_set_raw &, xml_node_struct *, xpath_allocator *)"
                 );
  }
  uVar5 = (uint)n->header & 0xf;
  switch((uint)(byte)this->_test) {
  case 1:
    if (uVar5 != 2) {
      return false;
    }
    goto LAB_001177ed;
  case 2:
    goto switchD_00117781_caseD_2;
  case 3:
    if (uVar5 == 5) goto switchD_00117781_caseD_2;
    break;
  case 4:
    if (uVar5 == 6) goto switchD_00117781_caseD_2;
    break;
  case 5:
    if (uVar5 - 3 < 2) goto switchD_00117781_caseD_2;
    break;
  case 6:
    if (uVar5 != 6) {
      return false;
    }
LAB_001177ed:
    if ((n->name != (char_t *)0x0) && (bVar7 = strequal(n->name,(this->_data).string), bVar7)) {
switchD_00117781_caseD_2:
      local_28._attribute._attr = (xml_attribute_struct *)0x0;
      pxVar4 = ns->_end;
      if (pxVar4 == ns->_eos) {
        local_28._node._root = n;
        xpath_node_set_raw::push_back_grow(ns,&local_28,alloc);
      }
      else {
        ns->_end = pxVar4 + 1;
        (pxVar4->_node)._root = n;
        (pxVar4->_attribute)._attr = (xml_attribute_struct *)0x0;
      }
      return true;
    }
    break;
  case 7:
    if (uVar5 == 2) goto switchD_00117781_caseD_2;
    break;
  case 8:
    if ((uVar5 == 2) && (pcVar3 = n->name, pcVar3 != (char_t *)0x0)) {
      cVar2 = *(this->_data).string;
      bVar7 = cVar2 == '\0';
      if ((!bVar7) && (*pcVar3 == cVar2)) {
        lVar6 = 1;
        do {
          cVar2 = (this->_data).string[lVar6];
          bVar7 = cVar2 == '\0';
          if (bVar7) break;
          pcVar1 = pcVar3 + lVar6;
          lVar6 = lVar6 + 1;
        } while (*pcVar1 == cVar2);
      }
      if (bVar7) goto switchD_00117781_caseD_2;
    }
  }
  return false;
}

Assistant:

bool step_push(xpath_node_set_raw& ns, xml_node_struct* n, xpath_allocator* alloc)
		{
			assert(n);

			xml_node_type type = PUGI__NODETYPE(n);

			switch (_test)
			{
			case nodetest_name:
				if (type == node_element && n->name && strequal(n->name, _data.nodetest))
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_type_node:
				ns.push_back(xml_node(n), alloc);
				return true;

			case nodetest_type_comment:
				if (type == node_comment)
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_type_text:
				if (type == node_pcdata || type == node_cdata)
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_type_pi:
				if (type == node_pi)
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_pi:
				if (type == node_pi && n->name && strequal(n->name, _data.nodetest))
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_all:
				if (type == node_element)
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_all_in_namespace:
				if (type == node_element && n->name && starts_with(n->name, _data.nodetest))
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			default:
				assert(false && "Unknown axis"); // unreachable
			}

			return false;
		}